

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O0

JointObservationDiscrete * __thiscall
MADPComponentDiscreteObservations::GetJointObservationDiscrete
          (MADPComponentDiscreteObservations *this,Index i)

{
  ostream *poVar1;
  undefined8 uVar2;
  char *arg;
  size_type sVar3;
  const_reference ppJVar4;
  E *this_00;
  uint in_ESI;
  long in_RDI;
  stringstream ss;
  JointObservationDiscrete *j;
  stringstream ss_1;
  stringstream *in_stack_fffffffffffffc68;
  E *in_stack_fffffffffffffc70;
  E *in_stack_fffffffffffffca0;
  stringstream local_338 [16];
  ostream local_328 [400];
  stringstream local_198 [16];
  ostream local_188 [380];
  uint local_c;
  
  local_c = in_ESI;
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    poVar1 = std::operator<<(local_188,
                             "MADPComponentDiscreteObservations::GetJointObservationDiscrete(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
    poVar1 = std::operator<<(poVar1,") - Error: not initialized. ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  if ((*(byte *)(in_RDI + 9) & 1) == 0) {
    arg = (char *)__cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffca0,arg);
    __cxa_throw(arg,&E::typeinfo,E::~E);
  }
  sVar3 = std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>::size
                    ((vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
                      *)(in_RDI + 0x20));
  if (in_ESI < sVar3) {
    ppJVar4 = std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>::
              operator[]((vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
                          *)(in_RDI + 0x20),(ulong)local_c);
    return *ppJVar4;
  }
  std::__cxx11::stringstream::stringstream(local_338);
  poVar1 = std::operator<<(local_328,
                           "WARNING MADPComponentDiscreteObservations::GetJointObservationDiscrete(Index i) index out of bounds (i="
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,in_stack_fffffffffffffc68);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

const JointObservationDiscrete* MADPComponentDiscreteObservations::
    GetJointObservationDiscrete(Index i) const
{
    if(!_m_initialized)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteObservations::GetJointObservationDiscrete("
            << i<<") - Error: not initialized. "<<endl;
        throw E(ss);
    }
    if(!_m_cachedAllJointObservations)
    {
        throw E("MADPComponentDiscreteObservations::GetJointObservationDiscrete: joint observations have not been created");
    }
    if(i < _m_jointObservationVec.size() )
    {
        const JointObservationDiscrete* j = _m_jointObservationVec[i];
        return( j );
    }
    //else        
    stringstream ss;
    ss << "WARNING MADPComponentDiscreteObservations::GetJointObservationDiscrete(Index i) index out of bounds (i="<< i <<")"<<endl;
    throw E(ss);
}